

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O1

ChebyshevCollection * __thiscall
ChebTools::ChebyshevCollection::make_inverse
          (ChebyshevCollection *__return_storage_ptr__,ChebyshevCollection *this,size_t N,
          double xmin,double xmax,int Mnorm,double tol,int max_refine_passes,bool assume_monotonic,
          bool unsafe_evaluation)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  VectorXd *pVVar4;
  double *pdVar5;
  undefined8 *puVar6;
  char *__function;
  ulong uVar7;
  Index size;
  ulong uVar8;
  double dVar9;
  Scalar SVar10;
  double dVar11;
  ArrayXd ynodes;
  double xmax_;
  double xmin_;
  size_t counter;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> exps;
  anon_class_64_8_38687d7a get_xsolns;
  double ytol;
  optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  *in_stack_fffffffffffffea8;
  undefined1 local_149;
  Array<double,__1,_1,_0,__1,_1> local_148;
  double local_138;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  int local_fc;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  double local_e0;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> local_b8;
  evaluator<Eigen::PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>_> local_a0;
  double *local_98;
  undefined1 *local_90;
  double *local_88;
  double *local_80;
  ChebyshevCollection *local_78;
  double *local_70;
  double *local_68;
  _Optional_payload_base<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  local_60;
  double local_38;
  
  local_149 = assume_monotonic;
  local_118 = xmax;
  local_110 = xmin;
  local_108 = xmax;
  local_fc = max_refine_passes;
  local_f8 = tol;
  local_e0 = xmin;
  if (unsafe_evaluation) {
    local_138 = y_unsafe(this,xmin);
    local_f0 = y_unsafe(this,local_108);
  }
  else {
    local_138 = operator()(this,xmin);
    local_f0 = operator()(this,local_108);
  }
  dVar9 = local_110;
  local_128 = local_138;
  local_120 = local_f0;
  if (local_f0 < local_138) {
    local_110 = local_118;
    local_118 = dVar9;
    local_120 = local_138;
    local_128 = local_f0;
  }
  local_e8 = 0;
  pVVar4 = get_CLnodes(N);
  uVar2 = (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar2 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
                 );
  }
  local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pdVar5 = local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (uVar2 != 0) {
    free((void *)0x0);
    if (uVar2 != 0) {
      if (uVar2 >> 0x3d == 0) {
        pdVar5 = (double *)malloc(uVar2 * 8);
        if (uVar2 != 1 && ((ulong)pdVar5 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar5 != (double *)0x0) goto LAB_0012ac9d;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = std::random_device::_M_fini;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    pdVar5 = local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
  }
LAB_0012ac9d:
  local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar5;
  dVar9 = local_120 - local_128;
  dVar11 = local_138 + local_f0;
  pdVar5 = (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  uVar7 = uVar2 & 0x7ffffffffffffffe;
  if (1 < (long)uVar2) {
    uVar8 = 0;
    do {
      pdVar1 = pdVar5 + uVar8;
      dVar3 = pdVar1[1];
      local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar8] = (*pdVar1 * dVar9 + dVar11) * 0.5;
      (local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
      uVar8)[1] = (dVar3 * dVar9 + dVar11) * 0.5;
      uVar8 = uVar8 + 2;
    } while (uVar8 < uVar7);
  }
  if ((long)uVar7 < (long)uVar2) {
    do {
      local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar7] = (pdVar5[uVar7] * dVar9 + dVar11) * 0.5;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar2;
  if ((long)uVar2 < 1) {
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Array<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Array<double, -1, 1>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
    ;
  }
  else {
    local_a0.m_d.data =
         (plainobjectbase_evaluator_data<double,_0>)
         (plainobjectbase_evaluator_data<double,_0>)
         local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_138 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>,3,0>
                ::run<Eigen::Array<double,_1,1,0,_1,1>>
                          ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_a0,
                           (scalar_max_op<double,_double,_0> *)&local_60,&local_148);
    if (0 < local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       ) {
      local_a0.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)
           local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      SVar10 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>,3,0>
               ::run<Eigen::Array<double,_1,1,0,_1,1>>
                         ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_a0,
                          (scalar_min_op<double,_double,_0> *)&local_60,&local_148);
      local_38 = (local_138 - SVar10) * 2.2e-14;
      local_98 = &local_38;
      local_90 = &local_149;
      local_88 = &local_118;
      local_80 = &local_110;
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8 = (undefined8 *)0x0;
      uStack_d0 = 0;
      local_a0.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)&local_148;
      local_78 = this;
      local_70 = &local_e0;
      local_68 = &local_108;
      local_d8 = (undefined8 *)operator_new(0x20);
      *local_d8 = &local_a0;
      local_d8[1] = &local_108;
      local_d8[2] = &local_e0;
      local_d8[3] = &local_e8;
      pcStack_c0 = std::
                   _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/include/ChebTools/ChebTools.h:798:22)>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/include/ChebTools/ChebTools.h:798:22)>
                 ::_M_manager;
      local_60._M_engaged = false;
      ChebyshevExpansion::
      dyadic_splitting<std::vector<ChebTools::ChebyshevExpansion,std::allocator<ChebTools::ChebyshevExpansion>>>
                (&local_b8,(ChebyshevExpansion *)N,(size_t)&local_d8,
                 (function<double_(double)> *)(ulong)(uint)Mnorm,local_128,local_120,local_fc,
                 local_f8,(int)&local_60,in_stack_fffffffffffffea8);
      std::
      _Optional_payload_base<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
      ::_M_reset(&local_60);
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,3);
      }
      ChebyshevCollection(__return_storage_ptr__,&local_b8);
      std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
      ~vector(&local_b8);
      free(local_148.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return __return_storage_ptr__;
    }
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Array<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Array<double, -1, 1>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
    ;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                ,0x19b,__function);
}

Assistant:

auto make_inverse(const std::size_t N, const double xmin, const double xmax,
            const int Mnorm, const double tol, const int max_refine_passes = 8, const bool assume_monotonic = true, const bool unsafe_evaluation=false) const {
            double xmin_ = xmin, xmax_ = xmax;
            double yxmin, yxmax;
            if (unsafe_evaluation){
                yxmin = (*this).y_unsafe(xmin); yxmax = (*this).y_unsafe(xmax);
            }
            else{
                yxmin = (*this)(xmin); yxmax = (*this)(xmax);
            }
            if (yxmin > yxmax) {
                std::swap(yxmin, yxmax);
                std::swap(xmin_, xmax_);
            }
            std::size_t counter = 0;

            // These are the values of y at the Chebyshev-Lobatto nodes for the inverse function
            // in the first pass
            Eigen::ArrayXd ynodes = ((yxmax - yxmin) * ChebTools::get_CLnodes(N).array() + (yxmax + yxmin)) * 0.5;
            // A small fudge factor is needed because there is a tiny loss in precision in calculation of ynodes
            // so it is not adequate to check direct float equality
            auto ytol = 2.2e-14*(ynodes.maxCoeff() - ynodes.minCoeff());

            auto get_xsolns = [&](double y) {
                std::vector<double> xsolns;
                auto ranges_overlap = [](double x1, double x2, double y1, double y2) { return x1 <= y2 && y1 <= x2; };

                // If a value of y precisely matches a value at the node, return the value of x at the node
                // This is important if the value of y is an extremum of y(x)
                if (std::abs(y - ynodes[0]) < ytol && assume_monotonic) { xsolns = { xmax_ }; }
                else if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol && assume_monotonic) { xsolns = { xmin_ }; }
                else {
                    // Solve for values of x given this value of y
                    for (auto& ex : m_exps) {
                        if (assume_monotonic) {
                            auto yvals = ex.get_node_function_values();
                            auto ymin = yvals(0), ymax = yvals(yvals.size() - 1);
                            if (ymin > ymax) {
                                std::swap(ymin, ymax);
                            }
                            if (y >= ymin && y <= ymax) {
                                xsolns.emplace_back(ex.monotonic_solvex(y));
                            }
                        }
                        else {
                            if (ranges_overlap(ex.xmin(), ex.xmax(), xmin, xmax)) {
                                bool only_in_domain = true;
                                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                                    xsolns.emplace_back(rt);
                                }
                                bool no_solns = xsolns.empty();
                                if (no_solns){
                                    if (std::abs(y - ynodes[0]) < ytol) { xsolns.push_back(xmax_); }
                                    if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol) { xsolns.push_back(xmin_); }
                                }
                            }
                        }
                    }
                }
                return xsolns;
            };

            auto f = [&](double y) {
                
                auto xsolns = get_xsolns(y);
                auto xtol = 1e-14*(xmax - xmin);
                
                counter++;
                decltype(xsolns) good_solns;
                for (auto & xsoln : xsolns) {
                    if (xsoln >= xmin-xtol && xsoln <= xmax+xtol) {
                        good_solns.push_back(xsoln);
                    }
                }
                auto Ngood_solns = good_solns.size();
                if (Ngood_solns == 1) {
                    return good_solns.front();
                }
                else if (Ngood_solns == 0) {
                    throw std::invalid_argument("No good solutions found for y: " + std::to_string(y) + "; " + std::to_string(xsolns.size()) + " solutions had been found");
                }
                else {
                    for (auto soln : xsolns){
                        std::cout << soln << std::endl;
                    }
                    throw std::invalid_argument("Multiple solutions (is not one-to-one) for y: " + std::to_string(y) + "; " + std::to_string(Ngood_solns) + " solutions found");
                }
            };
            auto exps = ChebyshevExpansion::dyadic_splitting<Container>(N, f, yxmin, yxmax, Mnorm, tol, max_refine_passes);
            return ChebyshevCollection(exps);
        }